

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O1

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator+=(ZZ<130UL> *this,ZZ<130UL> *zRight)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  size_t pos;
  long lVar4;
  ulong uVar5;
  word wVar6;
  
  lVar4 = 0;
  uVar5 = 0;
  do {
    uVar2 = (this->super_WW<130UL>)._words[lVar4];
    wVar6 = uVar2 + uVar5;
    (this->super_WW<130UL>)._words[lVar4] = wVar6;
    wVar3 = (zRight->super_WW<130UL>)._words[lVar4];
    if (CARRY8(uVar2,uVar5)) {
      (this->super_WW<130UL>)._words[lVar4] = wVar3;
    }
    else {
      uVar5 = wVar3 + wVar6;
      (this->super_WW<130UL>)._words[lVar4] = uVar5;
      uVar5 = (ulong)(uVar5 < (zRight->super_WW<130UL>)._words[lVar4]);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pwVar1 = (this->super_WW<130UL>)._words + 2;
  *pwVar1 = *pwVar1 & 3;
  return this;
}

Assistant:

ZZ& operator+=(const ZZ& zRight)
	{	
		word carry = 0;
		for (size_t pos = 0; pos < _wcount; ++pos)
			if ((_words[pos] += carry) < carry) 
				_words[pos] = zRight.GetWord(pos);
            else 
				carry = (_words[pos] += zRight.GetWord(pos)) < 
					zRight.GetWord(pos);
		Trim();
		return *this;
	}